

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O3

void __thiscall CMenus::SetMenuPage(CMenus *this,int NewPage)

{
  CGameClient *pCVar1;
  CCamera *pCVar2;
  uint uVar3;
  
  if (this->m_MenuPage != NewPage) {
    this->m_MenuPage = NewPage;
    uVar3 = 0;
    switch(NewPage) {
    case 5:
      uVar3 = 1;
      break;
    case 6:
      uVar3 = 2;
      break;
    case 7:
      uVar3 = 3;
      break;
    case 8:
      uVar3 = ((this->super_CComponent).m_pClient)->m_pConfig->m_UiSettingsPage + 4;
      if (uVar3 == 0xffffffff) {
        return;
      }
      break;
    default:
      goto switchD_0014c2ac_caseD_9;
    case 10:
      break;
    }
    pCVar1 = (this->super_CComponent).m_pClient;
    if ((pCVar1 != (CGameClient *)0x0) && (pCVar2 = pCVar1->m_pCamera, pCVar2 != (CCamera *)0x0)) {
      if ((uVar3 < 10) && (((pCVar2->super_CComponent).m_pClient)->m_pClient->m_State != 3)) {
        pCVar2->m_AnimationStartPos = pCVar2->m_Center;
        pCVar2->m_RotationCenter = pCVar2->m_Positions[uVar3];
        pCVar2->m_CurrentPosition = uVar3;
        pCVar2->m_MoveTime = 0.0;
      }
      return;
    }
  }
switchD_0014c2ac_caseD_9:
  return;
}

Assistant:

void CMenus::SetMenuPage(int NewPage)
{
	if(NewPage == m_MenuPage)
		return;

	m_MenuPage = NewPage;

	// update camera position
	{
		int CameraPos = -1;

		switch(m_MenuPage)
		{
		case PAGE_START: CameraPos = CCamera::POS_START; break;
		case PAGE_DEMOS: CameraPos = CCamera::POS_DEMOS; break;
		case PAGE_SETTINGS: CameraPos = CCamera::POS_SETTINGS_GENERAL+Config()->m_UiSettingsPage; break;
		case PAGE_INTERNET: CameraPos = CCamera::POS_INTERNET; break;
		case PAGE_LAN: CameraPos = CCamera::POS_LAN;
		}

		if(CameraPos != -1 && m_pClient && m_pClient->m_pCamera)
			m_pClient->m_pCamera->ChangePosition(CameraPos);
	}
}